

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clikit.h
# Opt level: O2

void __thiscall
clikit::ProcessOptions::operator()
          (ProcessOptions *this,
          vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
          *optionDefinitions)

{
  pointer pbVar1;
  pointer pOVar2;
  ProcessOptions *pPVar3;
  vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_> *pvVar4;
  __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
  _Var5;
  OptionDefinition *pOVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  pointer __x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pointer __x_00;
  pointer pOVar7;
  anon_class_16_2_6c671130 __f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  definedOptions;
  allocator<char> local_d1;
  ProcessOptions *local_d0;
  vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_> *local_c8;
  pointer local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  Option local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = (optionDefinitions->
             super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_d0 = this;
  local_c8 = optionDefinitions;
  for (__x = (optionDefinitions->
             super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
             )._M_impl.super__Vector_impl_data._M_start; pvVar4 = local_c8, __x != local_c0;
      __x = __x + 1) {
    pbVar1 = (__x->names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__x_00 = (__x->names).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; __x_00 != pbVar1; __x_00 = __x_00 + 1)
    {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_b8,__x_00);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_68,&__x->names);
    std::__cxx11::string::string((string *)&local_50,(string *)&__x->usage);
    Usage::add((Usage *)usage,&local_68,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
  }
  _Var5 = std::operator()((local_c8->
                          super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
                          )._M_impl.super__Vector_impl_data._M_start,
                          (local_c8->
                          super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
                          )._M_impl.super__Vector_impl_data._M_finish);
  pPVar3 = local_d0;
  pOVar6 = (pvVar4->
           super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (_Var5._M_current != pOVar6) {
    std::
    function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::operator()(&(_Var5._M_current)->lambda,&(local_d0->_firstArgs).arguments);
    pOVar6 = (pvVar4->
             super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  _Var5 = std::operator()((pvVar4->
                          super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
                          )._M_impl.super__Vector_impl_data._M_start,pOVar6);
  if (_Var5._M_current !=
      (pvVar4->
      super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"Bad options",&local_d1);
    local_a0.arguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a0.arguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.arguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __f.badOption = &local_a0;
    __f.definedOptions = &local_b8;
    std::operator()((pPVar3->_commandLine).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (pPVar3->_commandLine).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,__f);
    if (local_a0.arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_a0.arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::
      function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
      ::operator()(&(_Var5._M_current)->lambda,&local_a0.arguments);
    }
    Option::~Option(&local_a0);
  }
  pOVar2 = (pPVar3->_options).super__Vector_base<clikit::Option,_std::allocator<clikit::Option>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pOVar7 = (pPVar3->_options).
                super__Vector_base<clikit::Option,_std::allocator<clikit::Option>_>._M_impl.
                super__Vector_impl_data._M_start; pOVar7 != pOVar2; pOVar7 = pOVar7 + 1) {
    _Var5 = std::operator()((pvVar4->
                            super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                            (pvVar4->
                            super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
                            )._M_impl.super__Vector_impl_data._M_finish,pOVar7);
    if (_Var5._M_current !=
        (pvVar4->
        super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      std::
      function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
      ::operator()(&(_Var5._M_current)->lambda,&pOVar7->arguments);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void operator()(vector<OptionDefinition> optionDefinitions)
        {
            vector<string> definedOptions;

            // List defined options to know when to call "Bad Options"
            for (auto& option : optionDefinitions)
            {
                for (auto& name : option.names)
                {
                    definedOptions.push_back(name);
                }

                usage.add(option.names, option.usage);
            }

            // Check if "First args" is present
            auto firstArgsItr = find_if(ALL(optionDefinitions), [&](const OptionDefinition& definition)
            {
                return find(ALL(definition.names), "First args") != definition.names.end();
            });

            if (firstArgsItr != optionDefinitions.end())
            {
                firstArgsItr->lambda(_firstArgs.arguments);
            }

            // Check if "Bad Options" is present
            auto badOptionItr = find_if(ALL(optionDefinitions), [&](const OptionDefinition& definition)
            {
                return find(ALL(definition.names), "Bad options") != definition.names.end();
            });

            if (badOptionItr != optionDefinitions.end())
            {
                Option badOption{ "Bad options" };

                // List bad options names as "Bad Options" arguments
                for_each(_commandLine.begin(), _commandLine.end(), [&](string& arg)
                {
                    if (arg[0] == '-' && find(ALL(definedOptions), arg) == definedOptions.end())
                    {
                        badOption.arguments.push_back(arg);
                    }
                });

                // Run "Bad Options" lambda
                if (badOption.arguments.size())
                {
                    badOptionItr->lambda(badOption.arguments);
                }
            }

            // Process valid options
            for (auto& option : _options)
            {
                // For each defined options found in argv
                auto definitionItr = find_if(ALL(optionDefinitions), [&](const OptionDefinition& definition)
                {
                    return find_if(ALL(definition.names), 
                        [&](const string& definitionName) 
                        { 
                            return option.name == definitionName; 
                        }) != definition.names.end();
                });

                // Run option lambda
                if (definitionItr != optionDefinitions.end())
                {
                    definitionItr->lambda(option.arguments);
                }
            }
        }